

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O3

void QtPrivate::
     QPrivateSlotObject<void_(QSortFilterProxyModelPrivate::*)(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
     ::impl(int which,QSlotObjectBase *this_,QObject *r,void **a,bool *ret)

{
  long in_FS_OFFSET;
  anon_class_24_3_b5c2e676 local_40;
  void **local_28;
  QSortFilterProxyModelPrivate *local_20;
  Function local_18;
  ImplFn p_Stack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (which == 2) {
    *ret = ((ImplFn)a[1] == this_[1].m_impl || *a == (void *)0x0) && *a == *(void **)(this_ + 1);
  }
  else if (which == 1) {
    local_20 = (QSortFilterProxyModelPrivate *)(r->d_ptr).d;
    local_18 = *(Function *)(this_ + 1);
    p_Stack_10 = this_[1].m_impl;
    local_40.f = &local_18;
    local_40.o = &local_20;
    local_40.arg = &local_28;
    local_28 = a;
    FunctorCallBase::
    call_internal<void,QtPrivate::FunctorCall<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,QtPrivate::List<QModelIndex_const&,int,int,QModelIndex_const&,int>,void,void(QSortFilterProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>::call(void(QSortFilterProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int),QSortFilterProxyModelPrivate*,void**)::_lambda()_1_>
              (a,&local_40);
  }
  else if (which == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      operator_delete(this_,0x20);
      return;
    }
    goto LAB_0048cf59;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0048cf59:
  __stack_chk_fail();
}

Assistant:

static void impl(QSlotObjectBase *this_, QObject *r, void **a, int which, bool *ret)
#endif
    {
        const auto that = static_cast<QPrivateSlotObject*>(this_);
        switch (which) {
            case Destroy:
                delete that;
                break;
            case Call:
                FuncType::template call<Args, R>(that->object(),
                                                 static_cast<typename FuncType::Object *>(QObjectPrivate::get(r)), a);
                break;
            case Compare:
                *ret = *reinterpret_cast<Func *>(a) == that->object();
                break;
            case NumOperations: ;
        }
    }